

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

uint8_t * google::protobuf::internal::
          MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
          ::InternalSerialize(int field_number,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                             Value *value,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  uint uVar7;
  byte *pbVar8;
  uint uVar9;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar9 = field_number << 3;
  *ptr = (byte)uVar9 + 2;
  if (uVar9 < 0x80) {
    pbVar8 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar9 | 0x82;
    ptr[1] = (byte)(uVar9 >> 7);
    pbVar8 = ptr + 2;
    if (0x3fff < uVar9) {
      uVar4 = (uint)ptr[1];
      uVar9 = uVar9 >> 7;
      do {
        pbVar8[-1] = (byte)uVar4 | 0x80;
        uVar4 = uVar9 >> 7;
        *pbVar8 = (byte)uVar4;
        pbVar8 = pbVar8 + 1;
        bVar1 = 0x3fff < uVar9;
        uVar9 = uVar4;
      } while (bVar1);
    }
  }
  uVar9 = (uint)key->_M_string_length;
  uVar4 = (value->_cached_size_).size_.super___atomic_base<int>._M_i;
  uVar7 = uVar9 | 1;
  iVar2 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  uVar7 = uVar4 | 1;
  iVar3 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  uVar9 = uVar4 + uVar9 + (iVar3 * 9 + 0x49U >> 6) + (iVar2 * 9 + 0x49U >> 6) + 2;
  *pbVar8 = (byte)uVar9;
  if (uVar9 < 0x80) {
    pbVar5 = pbVar8 + 1;
  }
  else {
    *pbVar8 = (byte)uVar9 | 0x80;
    pbVar8[1] = (byte)(uVar9 >> 7);
    pbVar5 = pbVar8 + 2;
    if (0x3fff < uVar9) {
      uVar4 = (uint)pbVar8[1];
      uVar9 = uVar9 >> 7;
      do {
        pbVar5[-1] = (byte)uVar4 | 0x80;
        uVar4 = uVar9 >> 7;
        *pbVar5 = (byte)uVar4;
        pbVar5 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar9;
        uVar9 = uVar4;
      } while (bVar1);
    }
  }
  if (stream->end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar5);
  }
  __n = key->_M_string_length;
  if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)pbVar5)))) {
    *pbVar5 = 10;
    pbVar5[1] = (byte)__n;
    memcpy(pbVar5 + 2,(key->_M_dataplus)._M_p,__n);
    pbVar5 = pbVar5 + __n + 2;
  }
  else {
    pbVar5 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,key,pbVar5);
  }
  if (stream->end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar5);
  }
  *pbVar5 = 0x12;
  uVar9 = (value->_cached_size_).size_.super___atomic_base<int>._M_i;
  pbVar5[1] = (byte)uVar9;
  if (uVar9 < 0x80) {
    pbVar5 = pbVar5 + 2;
  }
  else {
    pbVar5 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(uVar9,pbVar5 + 1);
  }
  puVar6 = CoreML::Specification::MILSpec::Value::_InternalSerialize(value,pbVar5,stream);
  return puVar6;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }